

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MessageOptions::SharedCtor(MessageOptions *this)

{
  MessageOptions *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->message_set_wire_format_,0,4);
  return;
}

Assistant:

void MessageOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&message_set_wire_format_, 0, reinterpret_cast<char*>(&map_entry_) -
    reinterpret_cast<char*>(&message_set_wire_format_) + sizeof(map_entry_));
}